

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O0

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Enumerant::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  NullableValue<capnp::schema::Value::Reader> *other;
  Reader *pRVar1;
  ArrayPtr<const_char> AVar2;
  Maybe<capnp::schema::Value::Reader> local_90;
  undefined1 local_58 [8];
  NullableValue<capnp::schema::Value::Reader> name;
  CapnpcCppMain *this_local;
  
  name.field_1._40_8_ = this;
  annotationValue<capnp::schema::Enumerant::Reader>(&local_90,this,proto,0xf264a779fef191ce);
  other = kj::_::readMaybe<capnp::schema::Value::Reader>(&local_90);
  kj::_::NullableValue<capnp::schema::Value::Reader>::NullableValue
            ((NullableValue<capnp::schema::Value::Reader> *)local_58,other);
  kj::Maybe<capnp::schema::Value::Reader>::~Maybe(&local_90);
  pRVar1 = kj::_::NullableValue::operator_cast_to_Reader_((NullableValue *)local_58);
  if (pRVar1 == (Reader *)0x0) {
    AVar2 = (ArrayPtr<const_char>)capnp::schema::Enumerant::Reader::getName(&proto);
  }
  else {
    pRVar1 = kj::_::NullableValue<capnp::schema::Value::Reader>::operator->
                       ((NullableValue<capnp::schema::Value::Reader> *)local_58);
    AVar2 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(pRVar1);
  }
  kj::_::NullableValue<capnp::schema::Value::Reader>::~NullableValue
            ((NullableValue<capnp::schema::Value::Reader> *)local_58);
  return (StringPtr)AVar2;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_MAYBE(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name->getText();
    } else {
      return proto.getName();
    }
  }